

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::DeferredTestReporter::ReportFailure
          (DeferredTestReporter *this,TestDetails *details,char *failure)

{
  pointer pDVar1;
  char *local_50;
  undefined1 local_48 [40];
  
  pDVar1 = (this->m_results).
           super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar1[-1].failed = true;
  local_50 = failure;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_*&,_true>
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,&details->lineNumber,&local_50);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<std::pair<int,std::__cxx11::string>>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)&pDVar1[-1].failures,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::assign((char *)&pDVar1[-1].failureFile);
  return;
}

Assistant:

void DeferredTestReporter::ReportFailure(TestDetails const& details, char const* failure)
{
    DeferredTestResult& r = m_results.back();
    r.failed = true;
    r.failures.push_back(DeferredTestResult::Failure(details.lineNumber, failure));
    r.failureFile = details.filename;
}